

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O2

void __thiscall QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate(QGraphicsWidgetPrivate *this)

{
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QGraphicsWidgetPrivate_007eef38;
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&(this->actions).d);
  std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::~unique_ptr
            (&this->windowFrameMargins);
  std::
  unique_ptr<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  ::~unique_ptr(&this->windowData);
  QFont::~QFont(&this->font);
  QPalette::~QPalette(&this->palette);
  std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::~unique_ptr(&this->margins);
  QGraphicsItemPrivate::~QGraphicsItemPrivate(&this->super_QGraphicsItemPrivate);
  return;
}

Assistant:

QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate()
{
}